

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

int FIX::socket_connect(socket_handle socket,char *address,int port)

{
  int iVar1;
  char *__cp;
  sockaddr_in addr;
  
  __cp = socket_hostname(address);
  if (__cp == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    addr.sin_family = 2;
    addr.sin_port = (ushort)port << 8 | (ushort)port >> 8;
    addr.sin_addr.s_addr = inet_addr(__cp);
    iVar1 = connect(socket,(sockaddr *)&addr,0x10);
  }
  return iVar1;
}

Assistant:

int socket_connect(socket_handle socket, const char *address, int port) {
  const char *hostname = socket_hostname(address);
  if (hostname == 0) {
#ifdef _MSC_VER
    // In a case of Windows + MSVC, select() does not fire a write event for
    // a bare socket (no connection ever attempted). Therefore the later
    // logic, which is based on unconditional continuation with select(),
    // leads to a deadlock (the select never gets back) for the connecting session.
    // So keep going ahead with a bad address to issue a faulty connect.
    hostname = address;
#else
    return -1;
#endif
  }

  sockaddr_in addr;
  addr.sin_family = PF_INET;
  addr.sin_port = htons(port);
  addr.sin_addr.s_addr = inet_addr(hostname);

  int result = connect(socket, reinterpret_cast<sockaddr *>(&addr), sizeof(addr));

  return result;
}